

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::updateMonthMenuNames(QCalendarWidgetPrivate *this)

{
  QWidget *this_00;
  QCalendarModel *this_01;
  QAction **ppQVar1;
  long in_FS_OFFSET;
  QLocale local_60;
  QArrayDataPointer<char16_t> local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  for (local_3c = 1; local_3c < 0xd; local_3c = local_3c + 1) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = this->m_model;
    QWidget::locale(&local_60,this_00);
    QtPrivate::QCalendarModel::monthName((QString *)&local_58,this_01,&local_60,local_3c);
    QLocale::~QLocale(&local_60);
    ppQVar1 = QMap<int,_QAction_*>::operator[](&this->monthToAction,&local_3c);
    QAction::setText((QString *)*ppQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateMonthMenuNames()
{
    Q_Q(QCalendarWidget);

    for (int i = 1; i <= 12; i++) {
        QString monthName(m_model->monthName(q->locale(), i));
        monthToAction[i]->setText(monthName);
    }
}